

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O3

void __thiscall HeavyLight_Queries_Test::~HeavyLight_Queries_Test(HeavyLight_Queries_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HeavyLight, Queries) {
    srand(1);
    int n = 10;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        rep(a, 0, n) rep(b, a, n) {
            query(a, b);
        }
        break;
    }
}